

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O3

bool __thiscall LiteScript::Character::operator>(Character *this,String *str)

{
  char32_t cVar1;
  ulong uVar2;
  size_type sVar3;
  ulong uVar4;
  bool bVar5;
  String local_30;
  
  String::String(&local_30,(this->str->str)._M_dataplus._M_p[this->i]);
  uVar2 = (str->str)._M_string_length;
  sVar3 = local_30.str._M_string_length;
  if (uVar2 < local_30.str._M_string_length) {
    sVar3 = uVar2;
  }
  if (sVar3 != 0) {
    uVar4 = 0;
    do {
      cVar1 = (str->str)._M_dataplus._M_p[uVar4];
      bVar5 = (uint)cVar1 <= (uint)local_30.str._M_dataplus._M_p[uVar4];
      if (local_30.str._M_dataplus._M_p[uVar4] != cVar1) goto LAB_0013d63f;
      uVar4 = uVar4 + 1;
    } while (sVar3 != uVar4);
  }
  bVar5 = local_30.str._M_string_length != uVar2 &&
          -1 < (long)(local_30.str._M_string_length - uVar2);
LAB_0013d63f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_30.str._M_dataplus._M_p != &local_30.str.field_2) {
    operator_delete(local_30.str._M_dataplus._M_p);
  }
  return bVar5;
}

Assistant:

bool LiteScript::Character::operator>(const LiteScript::String& str) const {
    return (String(this->str[i]) > str);
}